

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc.cpp
# Opt level: O1

void __thiscall
NfcFilter::process4(NfcFilter *this,span<const_float,_18446744073709551615UL> src,float *dst)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float *pfVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  pfVar10 = src.mData;
  fVar11 = (this->fourth).z[0];
  fVar12 = (this->fourth).z[1];
  fVar13 = (this->fourth).z[2];
  fVar14 = (this->fourth).z[3];
  if (pfVar10 != src.mDataEnd) {
    fVar1 = (this->fourth).gain;
    fVar2 = (this->fourth).b1;
    fVar3 = (this->fourth).b2;
    fVar4 = (this->fourth).b3;
    fVar5 = (this->fourth).b4;
    fVar6 = (this->fourth).a1;
    fVar7 = (this->fourth).a2;
    fVar8 = (this->fourth).a3;
    fVar9 = (this->fourth).a4;
    fVar15 = fVar11;
    fVar16 = fVar13;
    do {
      fVar11 = -fVar7 * fVar12 + *pfVar10 * fVar1 + fVar15 * -fVar6;
      fVar18 = -fVar9 * fVar14 + -fVar8 * fVar16 + fVar3 * fVar12 + fVar2 * fVar15 + fVar11;
      fVar17 = fVar14 * fVar5;
      fVar11 = fVar11 + fVar15;
      fVar12 = fVar12 + fVar15;
      fVar13 = fVar18 + fVar16;
      fVar14 = fVar14 + fVar16;
      *dst = fVar17 + fVar16 * fVar4 + fVar18;
      pfVar10 = pfVar10 + 1;
      dst = dst + 1;
      fVar15 = fVar11;
      fVar16 = fVar13;
    } while (pfVar10 != src.mDataEnd);
  }
  (this->fourth).z[0] = fVar11;
  (this->fourth).z[1] = fVar12;
  (this->fourth).z[2] = fVar13;
  (this->fourth).z[3] = fVar14;
  return;
}

Assistant:

void NfcFilter::process4(const al::span<const float> src, float *RESTRICT dst)
{
    const float gain{fourth.gain};
    const float b1{fourth.b1};
    const float b2{fourth.b2};
    const float b3{fourth.b3};
    const float b4{fourth.b4};
    const float a1{fourth.a1};
    const float a2{fourth.a2};
    const float a3{fourth.a3};
    const float a4{fourth.a4};
    float z1{fourth.z[0]};
    float z2{fourth.z[1]};
    float z3{fourth.z[2]};
    float z4{fourth.z[3]};
    auto proc_sample = [gain,b1,b2,b3,b4,a1,a2,a3,a4,&z1,&z2,&z3,&z4](const float in) noexcept -> float
    {
        float y{in*gain - a1*z1 - a2*z2};
        float out{y + b1*z1 + b2*z2};
        z2 += z1;
        z1 += y;

        y = out - a3*z3 - a4*z4;
        out = y + b3*z3 + b4*z4;
        z4 += z3;
        z3 += y;
        return out;
    };
    std::transform(src.cbegin(), src.cend(), dst, proc_sample);
    fourth.z[0] = z1;
    fourth.z[1] = z2;
    fourth.z[2] = z3;
    fourth.z[3] = z4;
}